

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O0

void tokelse(tokcxdef *ctx,char *p,int len)

{
  int iVar1;
  undefined4 in_EDX;
  errcxdef *in_RSI;
  tokcxdef *in_RDI;
  int cnt;
  
  iVar1 = in_RDI->tokcxifcnt;
  if (((iVar1 == 0) || (in_RDI->tokcxif[iVar1 + -1] == '\x03')) ||
     (in_RDI->tokcxif[iVar1 + -1] == '\x04')) {
    errlogf(in_RSI,(char *)CONCAT44(in_EDX,iVar1),0);
  }
  else {
    if (in_RDI->tokcxif[iVar1 + -1] == '\x01') {
      in_RDI->tokcxif[iVar1 + -1] = '\x04';
    }
    else {
      in_RDI->tokcxif[iVar1 + -1] = '\x03';
    }
    tok_update_if_stat(in_RDI);
  }
  return;
}

Assistant:

static void tokelse(tokcxdef *ctx, char *p, int len)
{
    int cnt;
    
    /* if we're not expecting #else, it's an error */
    cnt = ctx->tokcxifcnt;
    if (cnt == 0 || ctx->tokcxif[cnt-1] == TOKIF_ELSE_YES
        || ctx->tokcxif[cnt-1] == TOKIF_ELSE_NO)
    {
        errlog(ctx->tokcxerr, ERR_BADPELSE);
        return;
    }

    /* switch to the appropriate #else state (opposite the #if state) */
    if (ctx->tokcxif[cnt-1] == TOKIF_IF_YES)
        ctx->tokcxif[cnt-1] = TOKIF_ELSE_NO;
    else
        ctx->tokcxif[cnt-1] = TOKIF_ELSE_YES;

    /* update the current status */
    tok_update_if_stat(ctx);
}